

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<int,_long_long,_0>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int *t,longlong *u,int *result)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *u;
  iVar2 = 0;
  if (lVar1 != -1) {
    if (lVar1 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    iVar2 = (int)((long)*t % lVar1);
  }
  *result = iVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }